

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2b_prov.c
# Opt level: O0

int ossl_blake2b_update(BLAKE2B_CTX *c,void *data,size_t datalen)

{
  ulong __n;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  size_t stashlen;
  size_t fill;
  uint8_t *in;
  size_t in_stack_000000e0;
  uint8_t *in_stack_000000e8;
  BLAKE2B_CTX *in_stack_000000f0;
  undefined8 local_38;
  undefined8 local_20;
  undefined8 local_18;
  
  __n = 0x80 - *(long *)(in_RDI + 0xe0);
  local_20 = in_RSI;
  local_18 = in_RDX;
  if (__n < in_RDX) {
    if (*(long *)(in_RDI + 0xe0) != 0) {
      memcpy((void *)(in_RDI + 0x60 + *(long *)(in_RDI + 0xe0)),in_RSI,__n);
      blake2b_compress(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0);
      *(undefined8 *)(in_RDI + 0xe0) = 0;
      local_20 = (void *)(__n + (long)in_RSI);
      local_18 = in_RDX - __n;
    }
    if (0x80 < local_18) {
      local_38 = local_18 & 0x7f;
      if (local_38 == 0) {
        local_38 = 0x80;
      }
      blake2b_compress(in_stack_000000f0,in_stack_000000e8,in_stack_000000e0);
      local_20 = (void *)((local_18 - local_38) + (long)local_20);
      local_18 = local_38;
    }
  }
  memcpy((void *)(in_RDI + 0x60 + *(long *)(in_RDI + 0xe0)),local_20,local_18);
  *(ulong *)(in_RDI + 0xe0) = local_18 + *(long *)(in_RDI + 0xe0);
  return 1;
}

Assistant:

int ossl_blake2b_update(BLAKE2B_CTX *c, const void *data, size_t datalen)
{
    const uint8_t *in = data;
    size_t fill;

    /*
     * Intuitively one would expect intermediate buffer, c->buf, to
     * store incomplete blocks. But in this case we are interested to
     * temporarily stash even complete blocks, because last one in the
     * stream has to be treated in special way, and at this point we
     * don't know if last block in *this* call is last one "ever". This
     * is the reason for why |datalen| is compared as >, and not >=.
     */
    fill = sizeof(c->buf) - c->buflen;
    if (datalen > fill) {
        if (c->buflen) {
            memcpy(c->buf + c->buflen, in, fill); /* Fill buffer */
            blake2b_compress(c, c->buf, BLAKE2B_BLOCKBYTES);
            c->buflen = 0;
            in += fill;
            datalen -= fill;
        }
        if (datalen > BLAKE2B_BLOCKBYTES) {
            size_t stashlen = datalen % BLAKE2B_BLOCKBYTES;
            /*
             * If |datalen| is a multiple of the blocksize, stash
             * last complete block, it can be final one...
             */
            stashlen = stashlen ? stashlen : BLAKE2B_BLOCKBYTES;
            datalen -= stashlen;
            blake2b_compress(c, in, datalen);
            in += datalen;
            datalen = stashlen;
        }
    }

    assert(datalen <= BLAKE2B_BLOCKBYTES);

    memcpy(c->buf + c->buflen, in, datalen);
    c->buflen += datalen; /* Be lazy, do not compress */

    return 1;
}